

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O2

void __thiscall SchnorrPubkey_FromPubkey_Test::TestBody(SchnorrPubkey_FromPubkey_Test *this)

{
  char *pcVar1;
  char *in_R9;
  bool parity [4];
  bool is_parity;
  string local_1d0;
  Pubkey pk_aa1;
  AssertionResult gtest_ar_6;
  string exp_pk_a;
  AssertionResult gtest_ar_2;
  string exp_pk_b;
  string exp_pk_c2;
  SchnorrPubkey spk_a1;
  Pubkey pk_a1;
  SchnorrPubkey spk_b2;
  SchnorrPubkey spk_b1;
  SchnorrPubkey spk_a2;
  Pubkey pk_b2;
  Pubkey pk_b1;
  Pubkey pk_a2;
  SchnorrPubkey actual_pubkey;
  string exp_pk_c2p;
  
  is_parity = false;
  cfd::core::Privkey::GetPubkey((Pubkey *)&exp_pk_a,&::sk);
  cfd::core::SchnorrPubkey::FromPubkey(&actual_pubkey,(Pubkey *)&exp_pk_a,&is_parity);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_pk_a);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&exp_pk_a,&::pubkey);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&exp_pk_b,&actual_pubkey);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&exp_pk_c2,"pubkey.GetHex()","actual_pubkey.GetHex()",&exp_pk_a,&exp_pk_b);
  std::__cxx11::string::~string((string *)&exp_pk_b);
  std::__cxx11::string::~string((string *)&exp_pk_a);
  if ((char)exp_pk_c2._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&exp_pk_a);
    if (exp_pk_c2._M_string_length == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)exp_pk_c2._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&exp_pk_b,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x67,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&exp_pk_b,(Message *)&exp_pk_a);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&exp_pk_b);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&exp_pk_a);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&exp_pk_c2._M_string_length);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&exp_pk_a,"pubkey_parity","is_parity",&pubkey_parity,&is_parity);
  if ((char)exp_pk_a._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&exp_pk_b);
    if (exp_pk_a._M_string_length == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)exp_pk_a._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&exp_pk_c2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x68,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&exp_pk_c2,(Message *)&exp_pk_b);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&exp_pk_c2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&exp_pk_b);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&exp_pk_a._M_string_length);
  std::__cxx11::string::string
            ((string *)&exp_pk_a,
             "024d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d",
             (allocator *)&exp_pk_b);
  cfd::core::Pubkey::Pubkey(&pk_a1,&exp_pk_a);
  std::__cxx11::string::~string((string *)&exp_pk_a);
  std::__cxx11::string::string
            ((string *)&exp_pk_a,
             "034d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d",
             (allocator *)&exp_pk_b);
  cfd::core::Pubkey::Pubkey(&pk_a2,&exp_pk_a);
  std::__cxx11::string::~string((string *)&exp_pk_a);
  std::__cxx11::string::string
            ((string *)&exp_pk_a,
             "02dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54",
             (allocator *)&exp_pk_b);
  cfd::core::Pubkey::Pubkey(&pk_b1,&exp_pk_a);
  std::__cxx11::string::~string((string *)&exp_pk_a);
  std::__cxx11::string::string
            ((string *)&exp_pk_a,
             "03dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54",
             (allocator *)&exp_pk_b);
  cfd::core::Pubkey::Pubkey(&pk_b2,&exp_pk_a);
  std::__cxx11::string::~string((string *)&exp_pk_a);
  std::__cxx11::string::string
            ((string *)&exp_pk_a,"4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d",
             (allocator *)&exp_pk_b);
  std::__cxx11::string::string
            ((string *)&exp_pk_b,"dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54",
             (allocator *)&exp_pk_c2);
  std::__cxx11::string::string
            ((string *)&exp_pk_c2,
             "03417885176062c3ae707af06059e7b5e65f733938f818da509eb3e5c4074b8124",
             (allocator *)&exp_pk_c2p);
  std::__cxx11::string::string
            ((string *)&exp_pk_c2p,
             "02417885176062c3ae707af06059e7b5e65f733938f818da509eb3e5c4074b8124",
             (allocator *)&local_1d0);
  cfd::core::SchnorrPubkey::FromPubkey(&spk_a1,&pk_a1,parity);
  cfd::core::SchnorrPubkey::FromPubkey(&spk_a2,&pk_a2,parity + 1);
  cfd::core::SchnorrPubkey::FromPubkey(&spk_b1,&pk_b1,parity + 2);
  cfd::core::SchnorrPubkey::FromPubkey(&spk_b2,&pk_b2,parity + 3);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_1d0,&spk_a1);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_2,"exp_pk_a","spk_a1.GetHex()",&exp_pk_a,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_1d0);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pk_aa1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x79,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pk_aa1,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pk_aa1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  gtest_ar_2.success_ = (bool)(parity[0] ^ 1);
  gtest_ar_2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (parity[0] != false) {
    testing::Message::Message((Message *)&pk_aa1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1d0,(internal *)&gtest_ar_2,(AssertionResult *)"parity[0]","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x7a,local_1d0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&pk_aa1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    std::__cxx11::string::~string((string *)&local_1d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&pk_aa1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_1d0,&spk_a2);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_2,"exp_pk_a","spk_a2.GetHex()",&exp_pk_a,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_1d0);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pk_aa1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x7b,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pk_aa1,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pk_aa1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  gtest_ar_2.success_ = parity[1];
  gtest_ar_2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (parity[1] == false) {
    testing::Message::Message((Message *)&pk_aa1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1d0,(internal *)&gtest_ar_2,(AssertionResult *)"parity[1]","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x7c,local_1d0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&pk_aa1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    std::__cxx11::string::~string((string *)&local_1d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&pk_aa1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_1d0,&spk_b1);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_2,"exp_pk_b","spk_b1.GetHex()",&exp_pk_b,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_1d0);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pk_aa1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x7d,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pk_aa1,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pk_aa1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  gtest_ar_2.success_ = (bool)(parity[2] ^ 1);
  gtest_ar_2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (parity[2] != false) {
    testing::Message::Message((Message *)&pk_aa1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1d0,(internal *)&gtest_ar_2,(AssertionResult *)"parity[2]","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x7e,local_1d0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&pk_aa1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    std::__cxx11::string::~string((string *)&local_1d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&pk_aa1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_1d0,&spk_b2);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_2,"exp_pk_b","spk_b2.GetHex()",&exp_pk_b,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_1d0);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pk_aa1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x7f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pk_aa1,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pk_aa1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  gtest_ar_2.success_ = parity[3];
  gtest_ar_2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (parity[3] == false) {
    testing::Message::Message((Message *)&pk_aa1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1d0,(internal *)&gtest_ar_2,(AssertionResult *)"parity[3]","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x80,local_1d0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&pk_aa1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    std::__cxx11::string::~string((string *)&local_1d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&pk_aa1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::SchnorrPubkey::CreatePubkey(&pk_aa1,&spk_a1,parity[0]);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_1d0,&pk_a1);
  cfd::core::Pubkey::GetHex_abi_cxx11_((string *)&gtest_ar_2,&pk_aa1);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_6,"pk_a1.GetHex()","pk_aa1.GetHex()",&local_1d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&local_1d0);
  if (gtest_ar_6.success_ == false) {
    testing::Message::Message((Message *)&local_1d0);
    if (gtest_ar_6.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x83,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_6.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_aa1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&spk_b2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&spk_b1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&spk_a2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&spk_a1);
  std::__cxx11::string::~string((string *)&exp_pk_c2p);
  std::__cxx11::string::~string((string *)&exp_pk_c2);
  std::__cxx11::string::~string((string *)&exp_pk_b);
  std::__cxx11::string::~string((string *)&exp_pk_a);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_b2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_b1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_a2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk_a1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&actual_pubkey);
  return;
}

Assistant:

TEST(SchnorrPubkey, FromPubkey) {
  bool is_parity = false;
  auto actual_pubkey = SchnorrPubkey::FromPubkey(sk.GetPubkey(), &is_parity);
  EXPECT_EQ(pubkey.GetHex(), actual_pubkey.GetHex());
  EXPECT_EQ(pubkey_parity, is_parity);

  Pubkey pk_a1("024d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d");
  Pubkey pk_a2("034d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d");
  Pubkey pk_b1("02dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54");
  Pubkey pk_b2("03dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54");
  std::string exp_pk_a = "4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d";
  std::string exp_pk_b = "dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54";
  std::string exp_pk_c2 = "03417885176062c3ae707af06059e7b5e65f733938f818da509eb3e5c4074b8124";
  std::string exp_pk_c2p = "02417885176062c3ae707af06059e7b5e65f733938f818da509eb3e5c4074b8124";

  bool parity[4];
  auto spk_a1 = SchnorrPubkey::FromPubkey(pk_a1, &parity[0]);
  auto spk_a2 = SchnorrPubkey::FromPubkey(pk_a2, &parity[1]);
  auto spk_b1 = SchnorrPubkey::FromPubkey(pk_b1, &parity[2]);
  auto spk_b2 = SchnorrPubkey::FromPubkey(pk_b2, &parity[3]);

  EXPECT_EQ(exp_pk_a, spk_a1.GetHex());
  EXPECT_FALSE(parity[0]);
  EXPECT_EQ(exp_pk_a, spk_a2.GetHex());
  EXPECT_TRUE(parity[1]);
  EXPECT_EQ(exp_pk_b, spk_b1.GetHex());
  EXPECT_FALSE(parity[2]);
  EXPECT_EQ(exp_pk_b, spk_b2.GetHex());
  EXPECT_TRUE(parity[3]);

  Pubkey pk_aa1 = spk_a1.CreatePubkey(parity[0]);
  EXPECT_EQ(pk_a1.GetHex(), pk_aa1.GetHex());

}